

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

ThisType * Gs::Matrix<std::complex<float>,_4UL,_4UL>::Identity(void)

{
  Matrix<std::complex<float>,_4UL,_4UL> *in_RDI;
  
  Matrix(in_RDI);
  LoadIdentity(in_RDI);
  return in_RDI;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }